

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::KNearestNeighborsClassifier::SharedCtor(KNearestNeighborsClassifier *this)

{
  this->nearestneighborsindex_ = (NearestNeighborsIndex *)0x0;
  this->numberofneighbors_ = (Int64Parameter *)0x0;
  this->_cached_size_ = 0;
  this->_oneof_case_[0] = 0;
  this->_oneof_case_[1] = 0;
  this->_oneof_case_[2] = 0;
  return;
}

Assistant:

void KNearestNeighborsClassifier::SharedCtor() {
  ::memset(&nearestneighborsindex_, 0, reinterpret_cast<char*>(&numberofneighbors_) -
    reinterpret_cast<char*>(&nearestneighborsindex_) + sizeof(numberofneighbors_));
  clear_has_ClassLabels();
  clear_has_DefaultClassLabel();
  clear_has_WeightingScheme();
  _cached_size_ = 0;
}